

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O0

btMatrix3x3 * MassMatrix(btScalar im,btMatrix3x3 *iwi,btVector3 *r)

{
  btMatrix3x3 *in_RDI;
  btMatrix3x3 cr;
  btMatrix3x3 *in_stack_ffffffffffffff30;
  btMatrix3x3 *in_stack_ffffffffffffff38;
  btScalar in_stack_ffffffffffffff5c;
  btVector3 *in_stack_ffffffffffffff68;
  btMatrix3x3 *in_stack_ffffffffffffffa8;
  btMatrix3x3 *in_stack_ffffffffffffffb0;
  
  Cross(in_stack_ffffffffffffff68);
  Diagonal(in_stack_ffffffffffffff5c);
  operator*(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  operator*(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Sub(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  return in_RDI;
}

Assistant:

static inline btMatrix3x3	MassMatrix(btScalar im,const btMatrix3x3& iwi,const btVector3& r)
{
	const btMatrix3x3	cr=Cross(r);
	return(Sub(Diagonal(im),cr*iwi*cr));
}